

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_Uniform.cpp
# Opt level: O1

void __thiscall
Nova::Boundary_Uniform<float,_2>::Find_Ghost_Regions
          (Boundary_Uniform<float,_2> *this,T_Grid *grid,Array<Nova::Range<int,_2>_> *regions,
          int number_of_ghost_cells)

{
  int *piVar1;
  pointer pRVar2;
  ulong uVar3;
  undefined8 uVar4;
  TV TVar5;
  long lVar6;
  Range<int,_2> domain;
  Vector<int,_2,_true> data_copy_1;
  Vector<int,_2,_true> data_copy;
  float local_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  T_STORAGE local_30;
  T_STORAGE local_28;
  
  lVar6 = 0;
  Grid<float,_2>::Cell_Indices((Grid<float,_2> *)&local_40,(int)grid);
  local_28._M_elems[1] = fStack_3c;
  local_28._M_elems[0] = local_40;
  do {
    piVar1 = (int *)((long)local_28._M_elems + lVar6);
    *piVar1 = *piVar1 - number_of_ghost_cells;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 8);
  local_30._M_elems[1] = fStack_34;
  local_30._M_elems[0] = local_38;
  lVar6 = 0;
  do {
    piVar1 = (int *)((long)local_30._M_elems + lVar6);
    *piVar1 = *piVar1 + number_of_ghost_cells;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 8);
  std::vector<Nova::Range<int,_2>,_std::allocator<Nova::Range<int,_2>_>_>::resize(&regions->_data,4)
  ;
  pRVar2 = (regions->_data).
           super__Vector_base<Nova::Range<int,_2>,_std::allocator<Nova::Range<int,_2>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((regions->_data).
      super__Vector_base<Nova::Range<int,_2>,_std::allocator<Nova::Range<int,_2>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pRVar2) {
    uVar4 = 0;
    uVar3 = 0;
  }
  else {
    *(ulong *)(pRVar2->min_corner)._data._M_elems =
         (ulong)(uint)fStack_3c << 0x20 | (ulong)local_28._M_elems & 0xffffffff;
    *(ulong *)(pRVar2->max_corner)._data._M_elems = CONCAT44(fStack_34,(int)local_40 + -1);
    pRVar2 = (regions->_data).
             super__Vector_base<Nova::Range<int,_2>,_std::allocator<Nova::Range<int,_2>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = (long)(regions->_data).
                  super__Vector_base<Nova::Range<int,_2>,_std::allocator<Nova::Range<int,_2>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pRVar2 >> 4;
    if (uVar3 < 2) {
      uVar4 = 1;
    }
    else {
      TVar5._data._M_elems[0] = (int)local_38 + 1;
      TVar5._data._M_elems[1] = (int)fStack_3c;
      pRVar2[1].min_corner._data = TVar5._data._M_elems;
      *(ulong *)pRVar2[1].max_corner._data._M_elems =
           (ulong)(uint)fStack_34 << 0x20 | (ulong)local_30._M_elems & 0xffffffff;
      pRVar2 = (regions->_data).
               super__Vector_base<Nova::Range<int,_2>,_std::allocator<Nova::Range<int,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar3 = (long)(regions->_data).
                    super__Vector_base<Nova::Range<int,_2>,_std::allocator<Nova::Range<int,_2>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pRVar2 >> 4;
      if (uVar3 < 3) {
        uVar4 = 2;
      }
      else {
        *(_Type *)pRVar2[2].min_corner._data._M_elems = local_28._M_elems;
        *(ulong *)pRVar2[2].max_corner._data._M_elems =
             (ulong)((int)fStack_3c - 1) << 0x20 | (ulong)local_30._M_elems & 0xffffffff;
        pRVar2 = (regions->_data).
                 super__Vector_base<Nova::Range<int,_2>,_std::allocator<Nova::Range<int,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar3 = (long)(regions->_data).
                      super__Vector_base<Nova::Range<int,_2>,_std::allocator<Nova::Range<int,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar2 >> 4;
        if (3 < uVar3) {
          pRVar2[3].min_corner._data =
               (T_STORAGE)
               ((ulong)((int)fStack_34 + 1) << 0x20 | (ulong)local_28._M_elems & 0xffffffff);
          *(_Type *)pRVar2[3].max_corner._data._M_elems = local_30._M_elems;
          return;
        }
        uVar4 = 3;
      }
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4,uVar3
            );
}

Assistant:

void Boundary_Uniform<T,d>::
Find_Ghost_Regions(const T_Grid& grid,Array<Range<int,d> >& regions,const int number_of_ghost_cells) const
{
    Range<int,d> domain=grid.Cell_Indices(),ghost=domain.Thickened(number_of_ghost_cells);
    regions.resize(T_Grid::number_of_faces_per_cell);
    Find_Ghost_Regions_Helper(regions,domain,ghost);
}